

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O3

int __thiscall
TCPListener::accept(TCPListener *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int *piVar2;
  TCPListenerError *pTVar3;
  undefined4 in_register_00000034;
  socklen_t remoteAddressLength;
  Address remoteAddress;
  socklen_t local_84;
  string local_80;
  string local_60;
  TCPSocket local_40;
  sockaddr local_38;
  
  if (this->listening == false) {
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,__fd));
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Could not accept while TCPListener is not listening","");
    TCPListenerError::TCPListenerError(pTVar3,&local_60,0);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  iVar1 = accept4((this->super_Socket).socketDescriptor,&local_38,&local_84,0);
  if (-1 < iVar1) {
    TCPSocket::TCPSocket(&local_40,iVar1);
    return local_40.super_Socket.socketDescriptor;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Could not accept connection","");
  TCPListenerError::TCPListenerError(pTVar3,&local_80,iVar1);
  __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
}

Assistant:

TCPSocket TCPListener::accept()
{
    if(!listening){
        throw TCPListenerError("Could not accept while TCPListener is not listening");
    }

    socklen_t remoteAddressLength;
    Address remoteAddress;
    int newSocketDescriptor = ::accept4(socketDescriptor, (sockaddr*)&remoteAddress, &remoteAddressLength, 0);

    if(newSocketDescriptor < 0)
    {
        int x = errno;
        throw TCPListenerError("Could not accept connection", x);
    }
    else
    {
        return TCPSocket(newSocketDescriptor);
    }
}